

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

bool __thiscall lzham::lzcompressor::send_configuration(lzcompressor *this)

{
  return true;
}

Assistant:

bool lzcompressor::send_configuration()
   {
      // TODO: Currently unused.
      //if (!m_codec.encode_bits(m_settings.m_fast_adaptive_huffman_updating, 1))
      //   return false;
      //if (!m_codec.encode_bits(0, 1))
      //   return false;

      return true;
   }